

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O1

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *this,uint d0,...)

{
  Matrix<double,__1,_1,_0,__1,_1> *__s;
  ulong __n;
  va_list vl;
  uint local_b8;
  
  this->_dims[0] = d0;
  this->_dims[1] = local_b8;
  if (d0 * local_b8 == 0) {
    __s = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  }
  else {
    __n = (ulong)(d0 * local_b8);
    __s = __gnu_cxx::new_allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocate
                    ((new_allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,__n,(void *)0x0)
    ;
    this->first = __s;
    memset(__s,0,__n * 0x10);
    this->last = __s + __n;
  }
  this->_array = __s;
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }